

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O0

void __thiscall Catch::ConsoleReporter::noMatchingTestCases(ConsoleReporter *this,string *spec)

{
  ostream *poVar1;
  string *in_RSI;
  long in_RDI;
  
  poVar1 = std::operator<<(*(ostream **)(in_RDI + 0x18),"No test cases matched \'");
  poVar1 = std::operator<<(poVar1,in_RSI);
  poVar1 = std::operator<<(poVar1,'\'');
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void ConsoleReporter::noMatchingTestCases(std::string const& spec) {
    stream << "No test cases matched '" << spec << '\'' << std::endl;
}